

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O2

void deqp::gls::anon_unknown_1::logProgram(TestLog *log,Functions *gl,deUint32 program)

{
  ostringstream *poVar1;
  bool bVar2;
  GLenum GVar3;
  char *pcVar4;
  ScopedLogSection infoLogSection;
  ScopedLogSection linkInfo;
  string programInfoLog;
  allocator<char> local_1f2;
  allocator<char> local_1f1;
  ScopedLogSection local_1f0;
  ScopedLogSection local_1e8;
  string local_1e0;
  GLchar *local_1c0;
  undefined8 local_1b8;
  GLchar local_1b0 [16];
  undefined1 local_1a0 [384];
  
  bVar2 = getProgramLinkStatus(gl,program);
  local_1a0._0_8_ = (ulong)(uint)local_1a0._4_4_ << 0x20;
  local_1c0 = local_1b0;
  local_1b8 = 0;
  local_1b0[0] = '\0';
  (*gl->getProgramiv)(program,0x8b84,(GLint *)local_1a0);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glGetProgramiv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x153);
  std::__cxx11::string::resize((ulong)&local_1c0,(char)local_1a0._0_8_);
  (*gl->getProgramInfoLog)(program,(GLsizei)local_1b8,(GLsizei *)0x0,local_1c0);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glGetProgramInfoLog()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a0,"Program Link Info",(allocator<char> *)&local_1f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"Program Link Info",&local_1f2);
  tcu::ScopedLogSection::ScopedLogSection(&local_1e8,log,(string *)local_1a0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)local_1a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1a0,"Info Log",&local_1f2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"Info Log",&local_1f1);
  tcu::ScopedLogSection::ScopedLogSection(&local_1f0,log,(string *)local_1a0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)local_1a0);
  poVar1 = (ostringstream *)(local_1a0 + 8);
  local_1a0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,(string *)&local_1c0);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  tcu::ScopedLogSection::~ScopedLogSection(&local_1f0);
  poVar1 = (ostringstream *)(local_1a0 + 8);
  local_1a0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Link result: ");
  pcVar4 = "Fail";
  if (bVar2) {
    pcVar4 = "Ok";
  }
  std::operator<<((ostream *)poVar1,pcVar4);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  tcu::ScopedLogSection::~ScopedLogSection(&local_1e8);
  std::__cxx11::string::~string((string *)&local_1c0);
  return;
}

Assistant:

void logProgram (TestLog& log, const glw::Functions& gl, deUint32 program)
{
	const bool				programLinkOk	= getProgramLinkStatus(gl, program);
	const string			programInfoLog	= getProgramInfoLog(gl, program);
	tcu::ScopedLogSection	linkInfo		(log, "Program Link Info", "Program Link Info");

	{
		tcu::ScopedLogSection infoLogSection(log, "Info Log", "Info Log");

		log << TestLog::Message << programInfoLog << TestLog::EndMessage;
	}

	log << TestLog::Message << "Link result: " << (programLinkOk ? "Ok" : "Fail") << TestLog::EndMessage;
}